

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

void xmlXPathCompUnaryExpr(xmlXPathParserContextPtr ctxt)

{
  bool bVar1;
  bool bVar2;
  int local_14;
  int found;
  int minus;
  xmlXPathParserContextPtr ctxt_local;
  
  local_14 = 0;
  bVar1 = false;
  while( true ) {
    bVar2 = true;
    if ((*ctxt->cur != ' ') && ((*ctxt->cur < 9 || (bVar2 = true, 10 < *ctxt->cur)))) {
      bVar2 = *ctxt->cur == '\r';
    }
    if (!bVar2) break;
    if (*ctxt->cur != '\0') {
      ctxt->cur = ctxt->cur + 1;
    }
  }
  while (*ctxt->cur == '-') {
    local_14 = 1 - local_14;
    bVar1 = true;
    if (*ctxt->cur != '\0') {
      ctxt->cur = ctxt->cur + 1;
    }
    while( true ) {
      bVar2 = true;
      if ((*ctxt->cur != ' ') && ((*ctxt->cur < 9 || (bVar2 = true, 10 < *ctxt->cur)))) {
        bVar2 = *ctxt->cur == '\r';
      }
      if (!bVar2) break;
      if (*ctxt->cur != '\0') {
        ctxt->cur = ctxt->cur + 1;
      }
    }
  }
  xmlXPathCompUnionExpr(ctxt);
  if ((ctxt->error == 0) && (bVar1)) {
    if (local_14 == 0) {
      xmlXPathCompExprAdd(ctxt,ctxt->comp->last,-1,XPATH_OP_PLUS,3,0,0,(void *)0x0,(void *)0x0);
    }
    else {
      xmlXPathCompExprAdd(ctxt,ctxt->comp->last,-1,XPATH_OP_PLUS,2,0,0,(void *)0x0,(void *)0x0);
    }
  }
  return;
}

Assistant:

static void
xmlXPathCompUnaryExpr(xmlXPathParserContextPtr ctxt) {
    int minus = 0;
    int found = 0;

    SKIP_BLANKS;
    while (CUR == '-') {
        minus = 1 - minus;
	found = 1;
	NEXT;
	SKIP_BLANKS;
    }

    xmlXPathCompUnionExpr(ctxt);
    CHECK_ERROR;
    if (found) {
	if (minus)
	    PUSH_UNARY_EXPR(XPATH_OP_PLUS, ctxt->comp->last, 2, 0);
	else
	    PUSH_UNARY_EXPR(XPATH_OP_PLUS, ctxt->comp->last, 3, 0);
    }
}